

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove.c
# Opt level: O3

int remove(char *__filename)

{
  int iVar1;
  int *piVar2;
  _PDCLIB_file_t *p_Var3;
  
  for (p_Var3 = _PDCLIB_filelist; p_Var3 != (_PDCLIB_file_t *)0x0; p_Var3 = p_Var3->next) {
    if (p_Var3->filename != (char *)0x0) {
      iVar1 = strcmp(p_Var3->filename,__filename);
      if (iVar1 == 0) goto LAB_00103978;
    }
  }
  iVar1 = unlink(__filename);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    piVar2 = _PDCLIB_errno_func();
    *piVar2 = iVar1;
LAB_00103978:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int remove( const char * pathname )
{
    int rc;
    struct _PDCLIB_file_t * current = _PDCLIB_filelist;

    while ( current != NULL )
    {
        if ( ( current->filename != NULL ) && ( strcmp( current->filename, pathname ) == 0 ) )
        {
            return EOF;
        }

        current = current->next;
    }

    if ( ( rc = unlink( pathname ) ) == -1 )
    {
        /* The 1:1 mapping in _PDCLIB_config.h ensures this works. */
        *_PDCLIB_errno_func() = errno;
    }

    return rc;
}